

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O0

int CfdCreateSimpleHandle(void **handle)

{
  void *pvVar1;
  undefined8 *in_RDI;
  CfdException *except;
  bool in_stack_00000067;
  CfdCapiManager *in_stack_00000068;
  undefined4 local_4;
  
  if (in_RDI != (undefined8 *)0x0) {
    cfd::Initialize();
    pvVar1 = cfd::capi::CfdCapiManager::CreateHandle(in_stack_00000068,in_stack_00000067);
    *in_RDI = pvVar1;
  }
  local_4 = (uint)(in_RDI == (undefined8 *)0x0);
  return local_4;
}

Assistant:

int CfdCreateSimpleHandle(void** handle) {
  try {
    if (handle == nullptr) return kCfdIllegalArgumentError;
    cfd::Initialize();
    *handle = cfd::capi::capi_instance.CreateHandle(true);
    return kCfdSuccess;
  } catch (const CfdException& except) {
    return except.GetErrorCode();
  } catch (...) {
    return kCfdUnknownError;
  }
}